

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O3

void state_TEXM3X2PAD(Context *ctx)

{
  int iVar1;
  uint uVar2;
  
  uVar2 = 0;
  if (ctx->minor_ver != 0xff) {
    uVar2 = (uint)ctx->minor_ver;
  }
  if (0x10003 < (uVar2 | (uint)ctx->major_ver << 0x10)) {
    failf(ctx,"%s","TEXM3X2PAD opcode not available after Shader Model 1.3");
  }
  state_texops(ctx,"TEXM3X2PAD",0,0);
  iVar1 = (ctx->dest_arg).regnum;
  ctx->texm3x2pad_src0 = ctx->source_args[0].regnum;
  ctx->texm3x2pad_dst0 = iVar1;
  return;
}

Assistant:

static void state_TEXM3X2PAD(Context *ctx)
{
    if (shader_version_atleast(ctx, 1, 4))
        fail(ctx, "TEXM3X2PAD opcode not available after Shader Model 1.3");
    state_texops(ctx, "TEXM3X2PAD", 0, 0);
    // !!! FIXME: check for correct opcode existance and order more rigorously?
    ctx->texm3x2pad_src0 = ctx->source_args[0].regnum;
    ctx->texm3x2pad_dst0 = ctx->dest_arg.regnum;
}